

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

hugeint_t __thiscall
duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::
Operation<duckdb::uhugeint_t,duckdb::hugeint_t>
          (VectorTryCastOperator<duckdb::NumericTryCast> *this,uhugeint_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  ValidityMask *pVVar2;
  uhugeint_t input_00;
  uhugeint_t input_01;
  hugeint_t output;
  hugeint_t local_60;
  string local_50;
  
  input_00.lower = input.lower;
  input_00.upper = (uint64_t)&local_60;
  pVVar2 = mask;
  bVar1 = Uhugeint::TryCast<duckdb::hugeint_t>((Uhugeint *)this,input_00,(hugeint_t *)mask);
  if (!bVar1) {
    input_01.upper = (uint64_t)pVVar2;
    input_01.lower = input_00.lower;
    CastExceptionText<duckdb::uhugeint_t,duckdb::hugeint_t>(&local_50,(duckdb *)this,input_01);
    local_60 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                         (&local_50,(ValidityMask *)input.upper,(idx_t)mask,(VectorTryCastData *)idx
                         );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return local_60;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}